

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_add_many_global
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT n,REF_GLOB *c2n,REF_INT *part,
          REF_INT exclude_part_id)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  REF_GLOB *global_orig;
  clock_t cVar4;
  long lVar5;
  REF_NODE ref_node_00;
  REF_INT n_00;
  ulong uVar6;
  REF_MPI pRVar7;
  double dVar8;
  REF_INT new_cell;
  REF_INT local;
  REF_INT local_nodes [27];
  uint local_e0;
  int local_d8;
  int local_d4;
  clock_t local_d0;
  REF_NODE local_c8;
  double local_c0;
  REF_MPI local_b8;
  REF_INT *local_b0;
  REF_INT local_a8 [30];
  
  pRVar7 = ref_node->ref_mpi;
  local_c8 = ref_node;
  local_b0 = part;
  if (pRVar7->timing < 0xb) {
    local_d0 = 0;
  }
  else {
    local_d0 = clock();
  }
  uVar2 = ref_cell->node_per;
  if ((int)(uVar2 * n) < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
           "ref_cell_add_many_global","malloc global of REF_GLOB negative");
    uVar2 = 1;
  }
  else {
    local_b8 = pRVar7;
    global_orig = (REF_GLOB *)malloc((ulong)(uVar2 * n) << 3);
    ref_node_00 = local_c8;
    if (global_orig == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
             "ref_cell_add_many_global","malloc global of REF_GLOB NULL");
      uVar2 = 2;
    }
    else {
      n_00 = 0;
      if (0 < n) {
        iVar1 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar5 = (long)iVar1 * (long)ref_cell->size_per;
            uVar6 = 0;
            do {
              if (local_b0[lVar5 + uVar6] != exclude_part_id) {
                global_orig[n_00] = c2n[lVar5 + uVar6];
                n_00 = n_00 + 1;
              }
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 != n);
      }
      uVar2 = ref_node_add_many(local_c8,n_00,global_orig);
      if (uVar2 == 0) {
        free(global_orig);
        pRVar7 = local_b8;
        local_c0 = 0.0;
        if (10 < local_b8->timing) {
          cVar4 = clock();
          local_c0 = (double)(cVar4 - local_d0);
        }
        if (10 < pRVar7->timing) {
          local_d0 = clock();
        }
        if (0 < n) {
          local_e0 = 0;
          uVar2 = 0;
          do {
            if (0 < ref_cell->node_per) {
              lVar5 = (long)(int)local_e0;
              uVar6 = 0;
              do {
                uVar3 = ref_node_local(ref_node_00,c2n[ref_cell->size_per * lVar5 + uVar6],&local_d4
                                      );
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x2f3,"ref_cell_add_many_global",(ulong)uVar3,"local");
                  printf("node %d %d cell %d %d global %ld\n",uVar6 & 0xffffffff,
                         (ulong)(uint)ref_cell->node_per,(ulong)local_e0,(ulong)(uint)n,
                         c2n[ref_cell->size_per * lVar5 + uVar6]);
                  return uVar3;
                }
                local_c8->part[local_d4] = local_b0[ref_cell->size_per * lVar5 + uVar6];
                local_a8[uVar6] = local_d4;
                uVar6 = uVar6 + 1;
                ref_node_00 = local_c8;
              } while ((long)uVar6 < (long)ref_cell->node_per);
            }
            if (ref_cell->last_node_is_an_id != 0) {
              iVar1 = ref_cell->size_per;
              local_a8[(long)iVar1 + -1] = (REF_INT)c2n[(int)(iVar1 * local_e0 + iVar1 + -1)];
            }
            uVar3 = ref_cell_with(ref_cell,local_a8,&local_d8);
            pRVar7 = local_b8;
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x2fd,"ref_cell_add_many_global",(ulong)uVar3,"with failed");
              uVar2 = uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return uVar2;
            }
            if ((local_d8 == -1) && (uVar3 = ref_cell_add(ref_cell,local_a8,&local_d8), uVar3 != 0))
            {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x300,"ref_cell_add_many_global",(ulong)uVar3,"add cell");
              return uVar3;
            }
            local_e0 = local_e0 + 1;
            ref_node_00 = local_c8;
          } while (local_e0 != n);
        }
        dVar8 = 0.0;
        if (10 < pRVar7->timing) {
          cVar4 = clock();
          dVar8 = (double)(cVar4 - local_d0);
        }
        uVar2 = 0;
        if (10 < pRVar7->timing) {
          printf(" node %f cell %f\n",local_c0 / 1000000.0,dVar8 / 1000000.0);
          uVar2 = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x2e5,"ref_cell_add_many_global",(ulong)uVar2,"many nodes");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add_many_global(REF_CELL ref_cell,
                                            REF_NODE ref_node, REF_INT n,
                                            REF_GLOB *c2n, REF_INT *part,
                                            REF_INT exclude_part_id) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB *global;
  REF_INT nnode;
  REF_INT node, cell;
  REF_INT local, local_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  clock_t tic = 0;
  clock_t node_toc = 0;
  clock_t cell_toc = 0;

  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  ref_malloc(global, ref_cell_node_per(ref_cell) * n, REF_GLOB);

  nnode = 0;
  for (cell = 0; cell < n; cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (exclude_part_id != part[node + ref_cell_size_per(ref_cell) * cell]) {
        global[nnode] = c2n[node + ref_cell_size_per(ref_cell) * cell];
        nnode++;
      }
  RSS(ref_node_add_many(ref_node, nnode, global), "many nodes");

  ref_free(global);
  if (10 < ref_mpi_timing(ref_mpi)) node_toc += (clock() - tic);
  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  /* set parts */
  for (cell = 0; cell < n; cell++) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      RSB(ref_node_local(
              ref_node, c2n[node + ref_cell_size_per(ref_cell) * cell], &local),
          "local", {
            printf("node %d %d cell %d %d global " REF_GLOB_FMT "\n", node,
                   ref_cell_node_per(ref_cell), cell, n,
                   c2n[node + ref_cell_size_per(ref_cell) * cell]);
          });
      ref_node_part(ref_node, local) =
          part[node + ref_cell_size_per(ref_cell) * cell];
      local_nodes[node] = local;
    }
    if (ref_cell_last_node_is_an_id(ref_cell))
      local_nodes[ref_cell_size_per(ref_cell) - 1] =
          (REF_INT)c2n[(ref_cell_size_per(ref_cell) - 1) +
                       ref_cell_size_per(ref_cell) * cell];
    RXS(ref_cell_with(ref_cell, local_nodes, &new_cell), REF_NOT_FOUND,
        "with failed");

    if (REF_EMPTY == new_cell)
      RSS(ref_cell_add(ref_cell, local_nodes, &new_cell), "add cell");
  }
  if (10 < ref_mpi_timing(ref_mpi)) cell_toc += (clock() - tic);

  if (10 < ref_mpi_timing(ref_mpi)) {
    printf(" node %f cell %f\n",
           ((REF_DBL)node_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)cell_toc) / ((REF_DBL)CLOCKS_PER_SEC));
  }

  return REF_SUCCESS;
}